

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O1

void __thiscall ipx::Basis::reportBasisData(Basis *this)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  const_iterator __begin1;
  double *pdVar5;
  const_iterator __end1;
  double dVar6;
  double dVar7;
  
  puts("\nBasis data");
  printf("    Num factorizations = %d\n",(ulong)(uint)this->num_factorizations_);
  printf("    Num updates = %d\n",(ulong)(uint)this->num_updates_);
  if (this->num_ftran_ != 0) {
    dVar7 = (double)this->num_ftran_;
    printf("    Average density of %7d FTRANs is %6.4f; sparse proportion = %6.4f\n",
           this->sum_ftran_density_ / dVar7,(double)this->num_ftran_sparse_ / dVar7);
  }
  if (this->num_btran_ != 0) {
    dVar7 = (double)this->num_btran_;
    printf("    Average density of %7d BTRANs is %6.4f; sparse proportion = %6.4f\n",
           this->sum_btran_density_ / dVar7,(double)this->num_btran_sparse_ / dVar7);
  }
  pdVar5 = (this->fill_factors_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar1 = (this->fill_factors_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  dVar7 = 0.0;
  if (pdVar5 != pdVar1) {
    uVar4 = (long)pdVar1 - (long)pdVar5;
    dVar7 = 1.0;
    do {
      dVar6 = pow(*pdVar5,1.0 / (double)(int)(uVar4 >> 3));
      dVar7 = dVar7 * dVar6;
      pdVar5 = pdVar5 + 1;
    } while (pdVar5 != pdVar1);
  }
  printf("    Mean fill-in %11.4g\n",dVar7);
  pdVar5 = (this->fill_factors_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar1 = (this->fill_factors_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  dVar7 = 0.0;
  pdVar3 = pdVar5;
  if (pdVar5 != pdVar1) {
    while (pdVar2 = pdVar3, pdVar5 = pdVar5 + 1, pdVar5 != pdVar1) {
      pdVar3 = pdVar5;
      if (*pdVar5 < *pdVar2 || *pdVar5 == *pdVar2) {
        pdVar3 = pdVar2;
      }
    }
    dVar7 = *pdVar2;
  }
  printf("    Max  fill-in %11.4g\n",dVar7);
  return;
}

Assistant:

void Basis::reportBasisData() const {
  printf("\nBasis data\n");
  printf("    Num factorizations = %d\n", (int)this->factorizations());
  printf("    Num updates = %d\n", (int)updates_total());
  if (this->num_ftran_) 
    printf("    Average density of %7d FTRANs is %6.4f; sparse proportion = %6.4f\n",
	   (int)this->num_ftran_, this->sum_ftran_density_ / this->num_ftran_, frac_ftran_sparse());
  if (this->num_btran_) 
    printf("    Average density of %7d BTRANs is %6.4f; sparse proportion = %6.4f\n",
	   (int)this->num_btran_, this->sum_btran_density_ / this->num_btran_, frac_btran_sparse());
  printf("    Mean fill-in %11.4g\n", mean_fill());
  printf("    Max  fill-in %11.4g\n", max_fill());

}